

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  byte bVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t *local_38;
  
  local_38 = son + cyclic_pos * 2;
  puVar6 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar11 = pos - cur_match;
  if (uVar11 < cyclic_size && depth != 0) {
    uVar4 = 0;
    uVar10 = 0;
    puVar5 = puVar6;
    do {
      uVar8 = 0;
      if (cyclic_pos < uVar11) {
        uVar8 = cyclic_size;
      }
      uVar9 = uVar4;
      if (uVar10 < uVar4) {
        uVar9 = uVar10;
      }
      puVar6 = son + ((cyclic_pos - uVar11) + uVar8) * 2;
      bVar7 = cur[(ulong)uVar9 - (ulong)uVar11];
      bVar1 = cur[uVar9];
      if (bVar7 == bVar1) {
        uVar9 = uVar9 + 1;
        if (len_limit < uVar9) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if ((int)len_limit < 0) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        while( true ) {
          if (len_limit <= uVar9) goto LAB_001b19ab;
          uVar3 = *(long *)(cur + ((ulong)uVar9 - (ulong)uVar11)) - *(long *)(cur + uVar9);
          if (uVar3 != 0) break;
          uVar9 = uVar9 + 8;
        }
        uVar2 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar9 = ((uint)(uVar2 >> 3) & 0x1fffffff) + uVar9;
        if (len_limit <= uVar9) {
LAB_001b19ab:
          *local_38 = *puVar6;
          *puVar5 = puVar6[1];
          return;
        }
        bVar7 = cur[(ulong)uVar9 - (ulong)uVar11];
        bVar1 = cur[uVar9];
      }
      if (bVar7 < bVar1) {
        *local_38 = cur_match;
        local_38 = puVar6 + 1;
        puVar6 = puVar5;
        puVar5 = local_38;
        uVar4 = uVar9;
      }
      else {
        *puVar5 = cur_match;
        puVar5 = puVar6;
        uVar10 = uVar9;
      }
      depth = depth - 1;
      if (depth == 0) break;
      cur_match = *puVar5;
      uVar11 = pos - cur_match;
      puVar5 = puVar6;
    } while (uVar11 < cyclic_size);
  }
  *puVar6 = 0;
  *local_38 = 0;
  return;
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		uint32_t *pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		const uint8_t *pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}